

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O2

int SetRudderSSC32(SSC32 *pSSC32,double angle)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = pSSC32->MidAngle;
  if (0.0 <= angle) {
    dVar4 = pSSC32->MinAngle;
    dVar6 = pSSC32->MaxAngle;
    dVar7 = dVar6 - dVar1;
  }
  else {
    dVar4 = pSSC32->MinAngle;
    dVar6 = pSSC32->MaxAngle;
    dVar7 = dVar1 - dVar4;
  }
  dVar6 = ABS(dVar6);
  dVar8 = ABS(dVar4);
  if (ABS(dVar4) <= dVar6) {
    dVar8 = dVar6;
  }
  dVar5 = ABS(dVar4);
  if (ABS(dVar4) <= dVar6) {
    dVar5 = dVar6;
  }
  iVar2 = (int)(((dVar1 + (dVar7 * angle) / dVar8) * 500.0) / dVar5);
  iVar3 = 500;
  if (iVar2 < 500) {
    iVar3 = iVar2;
  }
  iVar2 = -500;
  if (-500 < iVar3) {
    iVar2 = iVar3;
  }
  iVar3 = SetPWMSSC32(pSSC32,pSSC32->rudderchan,iVar2 + 0x5dc);
  return iVar3;
}

Assistant:

inline int SetRudderSSC32(SSC32* pSSC32, double angle)
{
	int pw = 0;
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	// Convert angle (in rad) into SSC32 pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pSSC32->MidAngle+angle*(pSSC32->MaxAngle-pSSC32->MidAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)): pSSC32->MidAngle+angle*(pSSC32->MidAngle-pSSC32->MinAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle));
	//angletmp = angle >= 0? pSSC32->MidAngle+urudder*(pSSC32->MaxAngle-pSSC32->MidAngle): pSSC32->MidAngle+urudder*(pSSC32->MidAngle-pSSC32->MinAngle);
	if (angletmp >= 0)
		pw = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
	else
		pw = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MID_PW_SSC32-DEFAULT_MIN_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
#else
	pw = DEFAULT_MID_PW_SSC32+(int)(angle*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)
		/(pSSC32->MaxAngle-pSSC32->MinAngle));
#endif // DISABLE_RUDDER_MIDANGLE

	pw = max(min(pw, DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);

	return SetPWMSSC32(pSSC32, pSSC32->rudderchan, pw);
}